

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCompilePDBName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  NameComponents *pNVar2;
  string *psVar3;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  NameComponents *local_f0;
  NameComponents *components_1;
  allocator<char> local_d9;
  string local_d8;
  cmValue local_b8;
  cmValue name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  NameComponents *local_88;
  NameComponents *components;
  cmValue local_78;
  cmValue config_name;
  undefined1 local_60 [8];
  string configProp;
  string configUpper;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  psVar3 = (string *)((long)&configProp.field_2 + 8);
  cmsys::SystemTools::UpperCase(psVar3,config);
  cmStrCat<char_const(&)[18],std::__cxx11::string&>
            ((string *)local_60,(char (*) [18])"COMPILE_PDB_NAME_",psVar3);
  components = (NameComponents *)GetProperty(this,(string *)local_60);
  local_78 = (cmValue)components;
  bVar1 = cmNonempty((cmValue)components);
  if (bVar1) {
    pNVar2 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
    local_88 = pNVar2;
    psVar3 = cmValue::operator*[abi_cxx11_(&local_78);
    std::operator+(&local_a8,&pNVar2->prefix,psVar3);
    std::operator+(__return_storage_ptr__,&local_a8,".pdb");
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"COMPILE_PDB_NAME",&local_d9);
    local_b8 = GetProperty(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    components_1 = (NameComponents *)local_b8.Value;
    bVar1 = cmNonempty(local_b8);
    if (bVar1) {
      pNVar2 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
      local_f0 = pNVar2;
      psVar3 = cmValue::operator*[abi_cxx11_(&local_b8);
      std::operator+(&local_110,&pNVar2->prefix,psVar3);
      std::operator+(__return_storage_ptr__,&local_110,".pdb");
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_111);
      std::allocator<char>::~allocator(&local_111);
    }
  }
  name.Value._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBName(
  const std::string& config) const
{
  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(config);
  std::string configProp = cmStrCat("COMPILE_PDB_NAME_", configUpper);
  cmValue config_name = this->GetProperty(configProp);
  if (cmNonempty(config_name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *config_name + ".pdb";
  }

  cmValue name = this->GetProperty("COMPILE_PDB_NAME");
  if (cmNonempty(name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *name + ".pdb";
  }

  return "";
}